

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_event_wake_pipe.c
# Opt level: O0

ares_event_t * ares_pipeevent_create(ares_event_thread_t *e)

{
  ares_status_t aVar1;
  ares_pipeevent_t *p_00;
  ares_status_t status;
  ares_pipeevent_t *p;
  ares_event_t *event;
  ares_event_thread_t *e_local;
  
  p = (ares_pipeevent_t *)0x0;
  event = (ares_event_t *)e;
  p_00 = ares_pipeevent_init();
  if (p_00 == (ares_pipeevent_t *)0x0) {
    e_local = (ares_event_thread_t *)0x0;
  }
  else {
    aVar1 = ares_event_update((ares_event_t **)&p,(ares_event_thread_t *)event,ARES_EVENT_FLAG_READ,
                              ares_pipeevent_cb,p_00->filedes[0],p_00,ares_pipeevent_destroy_cb,
                              ares_pipeevent_signal);
    if (aVar1 == ARES_SUCCESS) {
      e_local = (ares_event_thread_t *)p;
    }
    else {
      ares_pipeevent_destroy(p_00);
      e_local = (ares_event_thread_t *)0x0;
    }
  }
  return (ares_event_t *)e_local;
}

Assistant:

ares_event_t *ares_pipeevent_create(ares_event_thread_t *e)
{
  ares_event_t     *event = NULL;
  ares_pipeevent_t *p     = NULL;
  ares_status_t     status;

  p = ares_pipeevent_init();
  if (p == NULL) {
    return NULL;
  }

  status = ares_event_update(&event, e, ARES_EVENT_FLAG_READ, ares_pipeevent_cb,
                             p->filedes[0], p, ares_pipeevent_destroy_cb,
                             ares_pipeevent_signal);
  if (status != ARES_SUCCESS) {
    ares_pipeevent_destroy(p); /* LCOV_EXCL_LINE: DefensiveCoding */
    return NULL;               /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  return event;
}